

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent-client.c
# Opt level: O0

void agent_cancel_query(agent_pending_query *conn)

{
  agent_pending_query *conn_local;
  
  uxsel_del(conn->fd);
  close(conn->fd);
  del234(agent_pending_queries,conn);
  if ((conn->retbuf != (char *)0x0) && (conn->retbuf != conn->sizebuf)) {
    safefree(conn->retbuf);
  }
  safefree(conn);
  return;
}

Assistant:

void agent_cancel_query(agent_pending_query *conn)
{
    uxsel_del(conn->fd);
    close(conn->fd);
    del234(agent_pending_queries, conn);
    if (conn->retbuf && conn->retbuf != conn->sizebuf)
        sfree(conn->retbuf);
    sfree(conn);
}